

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O0

void obuf_rollback_to_svp(obuf *buf,obuf_svp *svp)

{
  int iVar1;
  int local_20;
  int i;
  int iovcnt;
  obuf_svp *svp_local;
  obuf *buf_local;
  
  if (svp->pos <= (ulong)(long)buf->pos) {
    iVar1 = obuf_iovcnt(buf);
    buf->pos = (int)svp->pos;
    buf->iov[buf->pos].iov_len = svp->iov_len;
    buf->used = svp->used;
    local_20 = buf->pos;
    while (local_20 = local_20 + 1, local_20 < iVar1) {
      buf->iov[local_20].iov_len = 0;
    }
    buf->reserved = false;
    return;
  }
  __assert_fail("svp->pos <= (size_t)buf->pos",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c",
                0xd5,"void obuf_rollback_to_svp(struct obuf *, struct obuf_svp *)");
}

Assistant:

void
obuf_rollback_to_svp(struct obuf *buf, struct obuf_svp *svp)
{
	assert(svp->pos <= (size_t)buf->pos);
	int iovcnt = obuf_iovcnt(buf);

	buf->pos = svp->pos;
	buf->iov[buf->pos].iov_len = svp->iov_len;
	buf->used = svp->used;
	int i;
	for (i = buf->pos + 1; i < iovcnt; i++)
		buf->iov[i].iov_len = 0;
#ifndef NDEBUG
	buf->reserved = false;
#endif
}